

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_srtp_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  SSL *ssl_00;
  bool bVar1;
  int iVar2;
  stack_st_SRTP_PROTECTION_PROFILE *sk;
  size_t sVar3;
  Type *pTVar4;
  StackIterator<stack_st_SRTP_PROTECTION_PROFILE> other;
  SRTP_PROTECTION_PROFILE *profile;
  StackIterator<stack_st_SRTP_PROTECTION_PROFILE> __end1;
  StackIterator<stack_st_SRTP_PROTECTION_PROFILE> __begin1;
  stack_st_SRTP_PROTECTION_PROFILE **__range1;
  CBB profile_ids;
  CBB contents;
  stack_st_SRTP_PROTECTION_PROFILE *profiles;
  SSL *ssl;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = (SSL *)hs->ssl;
  sk = (stack_st_SRTP_PROTECTION_PROFILE *)SSL_get_srtp_profiles(ssl_00);
  if (((sk == (stack_st_SRTP_PROTECTION_PROFILE *)0x0) ||
      (sVar3 = sk_SRTP_PROTECTION_PROFILE_num(sk), sVar3 == 0)) ||
     (iVar2 = SSL_is_dtls((SSL *)ssl_00), iVar2 == 0)) {
    return true;
  }
  iVar2 = CBB_add_u16(out_compressible,0xe);
  if (((iVar2 != 0) &&
      (iVar2 = CBB_add_u16_length_prefixed(out_compressible,(CBB *)((long)&profile_ids.u + 0x18)),
      iVar2 != 0)) &&
     (iVar2 = CBB_add_u16_length_prefixed((CBB *)((long)&profile_ids.u + 0x18),(CBB *)&__range1),
     iVar2 != 0)) {
    join_0x00000010_0x00000000_ = begin<stack_st_SRTP_PROTECTION_PROFILE>(sk);
    other = end<stack_st_SRTP_PROTECTION_PROFILE>(sk);
    while (bVar1 = internal::StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE>::operator!=
                             ((StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE> *)&__end1.idx_,
                              other), bVar1) {
      pTVar4 = internal::StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE>::operator*
                         ((StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE> *)&__end1.idx_);
      iVar2 = CBB_add_u16((CBB *)&__range1,(uint16_t)pTVar4->id);
      if (iVar2 == 0) {
        return false;
      }
      internal::StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE>::operator++
                ((StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE> *)&__end1.idx_);
    }
    iVar2 = CBB_add_u8((CBB *)((long)&profile_ids.u + 0x18),'\0');
    if ((iVar2 != 0) && (iVar2 = CBB_flush(out_compressible), iVar2 != 0)) {
      return true;
    }
    return false;
  }
  return false;
}

Assistant:

static bool ext_srtp_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                     CBB *out_compressible,
                                     ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  const STACK_OF(SRTP_PROTECTION_PROFILE) *profiles =
      SSL_get_srtp_profiles(ssl);
  if (profiles == NULL ||                               //
      sk_SRTP_PROTECTION_PROFILE_num(profiles) == 0 ||  //
      !SSL_is_dtls(ssl)) {
    return true;
  }

  CBB contents, profile_ids;
  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_srtp) ||
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &profile_ids)) {
    return false;
  }

  for (const SRTP_PROTECTION_PROFILE *profile : profiles) {
    if (!CBB_add_u16(&profile_ids, profile->id)) {
      return false;
    }
  }

  if (!CBB_add_u8(&contents, 0 /* empty use_mki value */) ||
      !CBB_flush(out_compressible)) {
    return false;
  }

  return true;
}